

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

bool __thiscall R1Interval::ApproxEquals(R1Interval *this,R1Interval *y,double max_error)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  double dVar5;
  
  dVar1 = (this->bounds_).c_[0];
  dVar5 = (this->bounds_).c_[1];
  if (dVar1 <= dVar5) {
    dVar2 = (y->bounds_).c_[0];
    dVar3 = (y->bounds_).c_[1];
    if (dVar2 <= dVar3) {
      if (max_error < ABS(dVar2 - dVar1)) {
        return false;
      }
      bVar4 = max_error < ABS(dVar3 - dVar5);
      goto LAB_0019a8b9;
    }
    dVar5 = dVar5 - dVar1;
  }
  else {
    dVar5 = (y->bounds_).c_[1] - (y->bounds_).c_[0];
  }
  bVar4 = max_error + max_error < dVar5;
LAB_0019a8b9:
  return !bVar4;
}

Assistant:

T operator[](int b) const {
    S2_DCHECK_GE(b, 0);
    S2_DCHECK_LT(b, SIZE);
    return static_cast<const D&>(*this).Data()[b];
  }